

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_suite_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer *__ptr;
  
  paVar6 = &(this->test_suite_name_).field_2;
  (this->test_suite_name_)._M_dataplus._M_p = (pointer)paVar6;
  pcVar2 = (a_test_suite_name->_M_dataplus)._M_p;
  paVar1 = &a_test_suite_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&a_test_suite_name->field_2 + 8);
    paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->test_suite_name_).field_2 + 8) = uVar3;
  }
  else {
    (this->test_suite_name_)._M_dataplus._M_p = pcVar2;
    (this->test_suite_name_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->test_suite_name_)._M_string_length = a_test_suite_name->_M_string_length;
  (a_test_suite_name->_M_dataplus)._M_p = (pointer)paVar1;
  a_test_suite_name->_M_string_length = 0;
  (a_test_suite_name->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (a_name->_M_dataplus)._M_p;
  paVar6 = &a_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&a_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar3;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar2;
    (this->name_).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = a_name->_M_string_length;
  (a_name->_M_dataplus)._M_p = (pointer)paVar6;
  a_name->_M_string_length = 0;
  (a_name->field_2)._M_local_buf[0] = '\0';
  if (a_type_param == (char *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    sVar5 = strlen(a_type_param);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar4,a_type_param,a_type_param + sVar5);
  }
  (this->type_param_)._M_t.
  super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = pbVar4;
  if (a_value_param == (char *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    sVar5 = strlen(a_value_param);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar4,a_value_param,a_value_param + sVar5);
  }
  (this->value_param_)._M_t.
  super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = pbVar4;
  paVar1 = &(this->location_).file.field_2;
  (this->location_).file._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (a_code_location->file)._M_dataplus._M_p;
  paVar6 = &(a_code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&(a_code_location->file).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->location_).file.field_2 + 8) = uVar3;
  }
  else {
    (this->location_).file._M_dataplus._M_p = pcVar2;
    (this->location_).file.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->location_).file._M_string_length = (a_code_location->file)._M_string_length;
  (a_code_location->file)._M_dataplus._M_p = (pointer)paVar6;
  (a_code_location->file)._M_string_length = 0;
  (a_code_location->file).field_2._M_local_buf[0] = '\0';
  (this->location_).line = a_code_location->line;
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->is_in_another_shard_ = false;
  this->factory_ = factory;
  internal::Mutex::Mutex(&(this->result_).test_properties_mutex_);
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_).death_test_count_ = 0;
  (this->result_).start_timestamp_ = 0;
  (this->result_).elapsed_time_ = 0;
  return;
}

Assistant:

TestInfo::TestInfo(std::string a_test_suite_name, std::string a_name,
                   const char* a_type_param, const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_suite_name_(std::move(a_test_suite_name)),
      name_(std::move(a_name)),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(std::move(a_code_location)),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      is_in_another_shard_(false),
      factory_(factory),
      result_() {}